

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O3

void ncnn::dynamic_quantize_2d_per_h(Mat *blob,Mat *blob_int8,Mat *scales,Option *opt)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  
  Mat::create(blob_int8,blob->w,blob->h,1,1,opt->workspace_allocator);
  Mat::create(scales,blob->h,4,1,opt->workspace_allocator);
  iVar8 = blob_int8->h;
  uVar7 = (ulong)iVar8;
  if (0 < (long)uVar7) {
    pvVar9 = blob->data;
    iVar1 = blob->w;
    uVar2 = blob_int8->w;
    pvVar3 = scales->data;
    sVar4 = blob->elemsize;
    uVar11 = 0;
    do {
      fVar14 = 0.0;
      if (0 < (int)uVar2) {
        uVar12 = 0;
        do {
          fVar15 = ABS(*(float *)((long)pvVar9 + uVar12 * 4));
          if (fVar14 <= fVar15) {
            fVar14 = fVar15;
          }
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      *(uint *)((long)pvVar3 + uVar11 * 4) =
           -(uint)(fVar14 == 0.0) & 0x3f800000 | ~-(uint)(fVar14 == 0.0) & (uint)(127.0 / fVar14);
      uVar11 = uVar11 + 1;
      pvVar9 = (void *)((long)pvVar9 + (long)iVar1 * sVar4);
    } while (uVar11 != uVar7);
    if (0 < iVar8) {
      uVar11 = (ulong)(uint)blob_int8->w;
      lVar13 = 0;
      do {
        iVar8 = (int)uVar11;
        if (0 < iVar8) {
          iVar1 = blob->w;
          fVar14 = *(float *)((long)scales->data + lVar13 * 4);
          sVar4 = blob_int8->elemsize;
          pvVar9 = blob_int8->data;
          sVar5 = blob->elemsize;
          pvVar3 = blob->data;
          lVar10 = 0;
          do {
            fVar15 = roundf(*(float *)((long)pvVar3 + lVar10 * 4 + sVar5 * lVar13 * (long)iVar1) *
                            fVar14);
            iVar6 = (int)fVar15;
            if (iVar6 < -0x7e) {
              iVar6 = -0x7f;
            }
            if (0x7e < iVar6) {
              iVar6 = 0x7f;
            }
            *(char *)((long)pvVar9 + lVar10 + sVar4 * lVar13 * (long)iVar8) = (char)iVar6;
            lVar10 = lVar10 + 1;
            uVar11 = (ulong)blob_int8->w;
          } while (lVar10 < (long)uVar11);
          uVar7 = (ulong)(uint)blob_int8->h;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (int)uVar7);
    }
  }
  return;
}

Assistant:

static void dynamic_quantize_2d_per_h(const Mat& blob, Mat& blob_int8, Mat& scales, const Option& opt)
{
    blob_int8.create(blob.w, blob.h, (size_t)1u, 1, opt.workspace_allocator);
    scales.create(blob.h, (size_t)4u, 1, opt.workspace_allocator);

    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);

        float absmax = 0.f;
        for (int j = 0; j < blob_int8.w; j++)
        {
            absmax = std::max(absmax, (float)fabs(ptr[j]));
        }

        scales[i] = absmax == 0.f ? 1.f : 127.f / absmax;
    }

    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);
        signed char* outptr = blob_int8.row<signed char>(i);
        const float scale = scales[i];

        for (int j = 0; j < blob_int8.w; j++)
        {
            outptr[j] = float2int8(ptr[j] * scale);
        }
    }
}